

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_critbit.c
# Opt level: O3

void test_keyvalue(CuTest *tc)

{
  size_t keylen;
  size_t sVar1;
  int i;
  critbit_tree cb;
  int result;
  char buffer [10];
  void *matches [2];
  int local_64;
  critbit_tree local_60;
  int local_58;
  char local_52 [10];
  void *local_48 [3];
  
  local_60.root = (void *)0x0;
  local_64 = 0xf0e0d0c;
  keylen = cb_new_kv("herp",4,&local_64,4,local_52);
  sVar1 = strlen(local_52);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x112,(char *)0x0,(int)sVar1 + 5,(int)keylen);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x113,(char *)0x0,local_52,"herp");
  cb_get_kv(local_52,&local_58,4);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x115,(char *)0x0,local_64,local_58);
  local_58 = cb_insert(&local_60,local_52,keylen);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x118,(char *)0x0,0,local_58);
  local_58 = cb_find_prefix(&local_60,"herp",5,local_48,2,0);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x11a,(char *)0x0,1,local_58);
  cb_get_kv(local_48[0],&local_58,4);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x11c,(char *)0x0,local_64,local_58);
  return;
}

Assistant:

static void test_keyvalue(CuTest * tc)
{
  critbit_tree cb = CRITBIT_TREE();
  int result, i = 0x0F0E0D0C;
  char buffer[10];
  void * matches[2];
  const char * key = "herp";
  size_t len = strlen(key);

  len = cb_new_kv(key, len, &i, sizeof(int), buffer);
  CuAssertIntEquals(tc, (int)(strlen(buffer)+1+sizeof(int)), (int)len);
  CuAssertStrEquals(tc, buffer, key);
  cb_get_kv(buffer, &result, sizeof(int));
  CuAssertIntEquals(tc, i, result);

  result = cb_insert(&cb, buffer, len);
  CuAssertIntEquals(tc, CB_SUCCESS, result);
  result = cb_find_prefix(&cb, key, strlen(key)+1, matches, 2, 0);
  CuAssertIntEquals(tc, 1, result);
  cb_get_kv(matches[0], &result, sizeof(int));
  CuAssertIntEquals(tc, i, result);
}